

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_writer_writebinary(FILE *out,sylvan_skiplist_t sl)

{
  size_t sVar1;
  int iVar2;
  uint32_t uVar3;
  MTBDD MVar4;
  mtbddnode_t n_00;
  uint64_t uVar5;
  uint64_t dd_00;
  uint64_t to;
  MTBDD high;
  MTBDD low;
  mtbddnode node;
  uint64_t value;
  uint32_t type;
  mtbddnode_t n;
  MTBDD dd;
  size_t i;
  size_t nodecount;
  sylvan_skiplist_t sl_local;
  FILE *out_local;
  
  nodecount = (size_t)sl;
  sl_local = (sylvan_skiplist_t)out;
  i = sylvan_skiplist_count(sl);
  fwrite(&i,8,1,(FILE *)sl_local);
  for (dd = 1; dd <= i; dd = dd + 1) {
    MVar4 = sylvan_skiplist_getr((sylvan_skiplist_t)nodecount,dd);
    n_00 = MTBDD_GETNODE(MVar4);
    iVar2 = mtbddnode_isleaf(n_00);
    sVar1 = nodecount;
    if (iVar2 == 0) {
      uVar5 = mtbddnode_getlow(n_00);
      uVar5 = sylvan_skiplist_get((sylvan_skiplist_t)sVar1,uVar5);
      dd_00 = mtbddnode_gethigh(n_00);
      sVar1 = nodecount;
      MVar4 = MTBDD_STRIPMARK(dd_00);
      to = sylvan_skiplist_get((sylvan_skiplist_t)sVar1,MVar4);
      MVar4 = MTBDD_TRANSFERMARK(dd_00,to);
      uVar3 = mtbddnode_getvariable(n_00);
      mtbddnode_makenode((mtbddnode_t)&low,uVar3,uVar5,MVar4);
      fwrite(&low,0x10,1,(FILE *)sl_local);
    }
    else {
      fwrite(n_00,0x10,1,(FILE *)sl_local);
      uVar3 = mtbddnode_gettype(n_00);
      node.b = mtbddnode_getvalue(n_00);
      sylvan_mt_write_binary(uVar3,node.b,(FILE *)sl_local);
    }
  }
  return;
}

Assistant:

void
mtbdd_writer_writebinary(FILE *out, sylvan_skiplist_t sl)
{
    size_t nodecount = sylvan_skiplist_count(sl);
    fwrite(&nodecount, sizeof(size_t), 1, out);
    for (size_t i=1; i<=nodecount; i++) {
        MTBDD dd = sylvan_skiplist_getr(sl, i);

        mtbddnode_t n = MTBDD_GETNODE(dd);
        if (mtbddnode_isleaf(n)) {
            /* write leaf */
            fwrite(n, sizeof(struct mtbddnode), 1, out);
            uint32_t type = mtbddnode_gettype(n);
            uint64_t value = mtbddnode_getvalue(n);
            sylvan_mt_write_binary(type, value, out);
        } else {
            struct mtbddnode node;
            MTBDD low = sylvan_skiplist_get(sl, mtbddnode_getlow(n));
            MTBDD high = mtbddnode_gethigh(n);
            high = MTBDD_TRANSFERMARK(high, sylvan_skiplist_get(sl, MTBDD_STRIPMARK(high)));
            mtbddnode_makenode(&node, mtbddnode_getvariable(n), low, high);
            fwrite(&node, sizeof(struct mtbddnode), 1, out);
        }
    }
}